

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> __thiscall
tonk::MakeUniqueNoThrow<tonk::NATHolePuncher,tonk::protocol::P2PConnectParams_const&>
          (tonk *this,P2PConnectParams *args)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 *puVar6;
  
  puVar6 = (undefined8 *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  if (puVar6 != (undefined8 *)0x0) {
    *(undefined4 *)(puVar6 + 4) = *(undefined4 *)&args->SelfExternalPort;
    uVar4 = args->EncryptionKey;
    uVar1 = *(undefined8 *)&args->ProtocolRoundIntervalMsec;
    uVar5 = args->ShotTimeUsec;
    *puVar6 = *(undefined8 *)args;
    puVar6[1] = uVar4;
    puVar6[2] = uVar1;
    puVar6[3] = uVar5;
    uVar1 = *(undefined8 *)((long)&(args->PeerExternalAddress).impl_.data_ + 8);
    uVar2 = *(undefined8 *)((long)&(args->PeerExternalAddress).impl_.data_ + 0xc);
    uVar3 = *(undefined8 *)((long)&(args->PeerExternalAddress).impl_.data_ + 0x14);
    *(undefined8 *)((long)puVar6 + 0x24) = *(undefined8 *)&(args->PeerExternalAddress).impl_.data_;
    *(undefined8 *)((long)puVar6 + 0x2c) = uVar1;
    puVar6[6] = uVar2;
    puVar6[7] = uVar3;
    *(undefined4 *)(puVar6 + 8) = 0;
    *(undefined1 *)((long)puVar6 + 0x44) = 0;
    *(undefined4 *)(puVar6 + 9) = 0;
    puVar6[10] = 0;
    *(undefined4 *)(puVar6 + 0xb) = 0;
  }
  *(undefined8 **)this = puVar6;
  return (__uniq_ptr_data<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>,_true,_true>
          )(__uniq_ptr_data<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}